

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

void __thiscall cs::statement_var::dump(statement_var *this,ostream *o)

{
  long lVar1;
  char *pcVar2;
  bool bVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"< Var: ",7);
  compiler_type::dump_expr((this->mTree).mRoot,o);
  pcVar2 = "";
  bVar3 = this->link != false;
  if (bVar3) {
    pcVar2 = ", type = link";
  }
  lVar1 = 0xd;
  if (!bVar3) {
    lVar1 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,pcVar2,lVar1);
  std::__ostream_insert<char,std::char_traits<char>>(o," >\n",3);
  return;
}

Assistant:

void statement_var::dump(std::ostream &o) const
	{
		o << "< Var: ";
		compiler_type::dump_expr(mTree.root(), o);
		o << (link ? ", type = link" : "") << " >\n";
	}